

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.c
# Opt level: O2

void ugui_graphics_draw_text
               (ugui_graphics_t *graphics,char *text,font_style_t *font,ugui_point_t point)

{
  ugui_sprite_t sprite_00;
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 local_58 [8];
  ugui_sprite_t sprite;
  
  uVar2 = (uint)point & 0xffff0000;
  sprite.data = &font->glyph_count;
  sVar1 = strlen(text);
  for (uVar3 = 0; (sVar1 & 0xffff) != uVar3; uVar3 = uVar3 + 1) {
    _ugui_font_get_glyph((font_style_t *)sprite.data,text[uVar3],(ugui_sprite_t *)local_58);
    sprite_00.h = local_58._2_2_;
    sprite_00.w_bytes = local_58._4_2_;
    sprite_00._6_2_ = local_58._6_2_;
    sprite_00.data = (uint8_t *)sprite._0_8_;
    sprite_00.w = local_58._0_2_;
    ugui_graphics_draw_sprite(graphics,sprite_00,(ugui_point_t)((uint)point & 0xffff | uVar2));
    point = (ugui_point_t)((uint)(ushort)local_58._0_2_ + ((uint)point & 0xffff));
  }
  return;
}

Assistant:

void ugui_graphics_draw_text(ugui_graphics_t* graphics, char* text, font_style_t* font, ugui_point_t point)
{
	uint16_t length = strlen(text);
	ugui_sprite_t sprite;

	for (uint16_t i = 0; i < length; i++) {
		char c = text[i];
		_ugui_font_get_glyph(font, c, &sprite);
		ugui_graphics_draw_sprite(graphics, sprite, point);
		point.x += sprite.w;
	}
}